

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

void __thiscall
nlohmann::detail::
binary_writer<nlohmann::basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,unsigned_char>
::write_number<unsigned_int,false>
          (binary_writer<nlohmann::basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,unsigned_char>
           *this,uint n)

{
  uint *puVar1;
  iterator __first;
  iterator __last;
  element_type *peVar2;
  pointer pvVar3;
  array<unsigned_char,_4UL> local_18;
  uint local_14;
  array<unsigned_char,_4UL> vec;
  uint n_local;
  binary_writer<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_unsigned_char>
  *this_local;
  
  local_14 = n;
  _vec = this;
  memset(&local_18,0,4);
  puVar1 = (uint *)std::array<unsigned_char,_4UL>::data(&local_18);
  *puVar1 = local_14;
  if (((byte)*this & 1) != 0) {
    __first = std::array<unsigned_char,_4UL>::begin(&local_18);
    __last = std::array<unsigned_char,_4UL>::end(&local_18);
    std::reverse<unsigned_char*>(__first,__last);
  }
  peVar2 = std::
           __shared_ptr_access<nlohmann::detail::output_adapter_protocol<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<nlohmann::detail::output_adapter_protocol<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)(this + 8));
  pvVar3 = std::array<unsigned_char,_4UL>::data(&local_18);
  (*peVar2->_vptr_output_adapter_protocol[1])(peVar2,pvVar3,4);
  return;
}

Assistant:

void write_number(const NumberType n)
    {
        // step 1: write number to array of length NumberType
        std::array<CharType, sizeof(NumberType)> vec{};
        std::memcpy(vec.data(), &n, sizeof(NumberType));

        // step 2: write array to output (with possible reordering)
        if (is_little_endian != OutputIsLittleEndian)
        {
            // reverse byte order prior to conversion if necessary
            std::reverse(vec.begin(), vec.end());
        }

        oa->write_characters(vec.data(), sizeof(NumberType));
    }